

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

int err_set_logfile(char *path)

{
  FILE *stream;
  FILE *__stream;
  FILE *oldfp;
  FILE *newfp;
  char *path_local;
  
  stream = fopen(path,"a");
  if (stream == (FILE *)0x0) {
    path_local._4_4_ = -1;
  }
  else {
    __stream = (FILE *)err_get_logfp();
    err_set_logfp((FILE *)stream);
    if (((__stream != (FILE *)0x0) && (__stream != _stdout)) && (__stream != _stderr)) {
      fclose(__stream);
    }
    path_local._4_4_ = 0;
  }
  return path_local._4_4_;
}

Assistant:

int
err_set_logfile(const char *path)
{
    FILE *newfp, *oldfp;

    if ((newfp = fopen(path, "a")) == NULL)
        return -1;
    oldfp = err_get_logfp();
    err_set_logfp(newfp);
    if (oldfp != NULL && oldfp != stdout && oldfp != stderr)
        fclose(oldfp);
    return 0;
}